

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordTopocentric.h
# Opt level: O0

string * __thiscall
libsgp4::CoordTopocentric::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CoordTopocentric *this)

{
  _Setprecision _Var1;
  _Setw _Var2;
  void *this_00;
  ostream *poVar3;
  double dVar4;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  CoordTopocentric *local_18;
  CoordTopocentric *this_local;
  
  local_18 = this;
  this_local = (CoordTopocentric *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = (void *)std::ostream::operator<<(local_190,std::right);
  poVar3 = (ostream *)std::ostream::operator<<(this_00,std::fixed);
  _Var1 = std::setprecision(3);
  std::operator<<(poVar3,_Var1);
  poVar3 = std::operator<<(local_190,"Az: ");
  _Var2 = std::setw(8);
  poVar3 = std::operator<<(poVar3,_Var2);
  dVar4 = Util::RadiansToDegrees(this->azimuth);
  std::ostream::operator<<(poVar3,dVar4);
  poVar3 = std::operator<<(local_190,", El: ");
  _Var2 = std::setw(8);
  poVar3 = std::operator<<(poVar3,_Var2);
  dVar4 = Util::RadiansToDegrees(this->elevation);
  std::ostream::operator<<(poVar3,dVar4);
  poVar3 = std::operator<<(local_190,", Rng: ");
  _Var2 = std::setw(10);
  poVar3 = std::operator<<(poVar3,_Var2);
  std::ostream::operator<<(poVar3,this->range);
  poVar3 = std::operator<<(local_190,", Rng Rt: ");
  _Var2 = std::setw(7);
  poVar3 = std::operator<<(poVar3,_Var2);
  std::ostream::operator<<(poVar3,this->range_rate);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        std::stringstream ss;
        ss << std::right << std::fixed << std::setprecision(3);
        ss << "Az: " << std::setw(8) << Util::RadiansToDegrees(azimuth);
        ss << ", El: " << std::setw(8) << Util::RadiansToDegrees(elevation);
        ss << ", Rng: " << std::setw(10) << range;
        ss << ", Rng Rt: " << std::setw(7) << range_rate;
        return ss.str();
    }